

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GPUShaderFP64Test5::iterate(GPUShaderFP64Test5 *this)

{
  bool bVar1;
  NotSupportedError *pNVar2;
  char *description;
  _test_case *test_case;
  long lVar3;
  allocator<char> local_5b5;
  allocator<char> local_5b4;
  allocator<char> local_5b3;
  allocator<char> local_5b2;
  allocator<char> local_5b1;
  allocator<char> local_5b0;
  allocator<char> local_5af;
  allocator<char> local_5ae;
  allocator<char> local_5ad;
  allocator<char> local_5ac;
  allocator<char> local_5ab;
  allocator<char> local_5aa;
  allocator<char> local_5a9;
  allocator<char> local_5a8;
  allocator<char> local_5a7;
  allocator<char> local_5a6;
  allocator<char> local_5a5;
  allocator<char> local_5a4;
  allocator<char> local_5a3;
  allocator<char> local_5a2;
  allocator<char> local_5a1;
  allocator<char> local_5a0;
  allocator<char> local_59f;
  allocator<char> local_59e;
  allocator<char> local_59d;
  allocator<char> local_59c;
  allocator<char> local_59b;
  allocator<char> local_59a;
  allocator<char> local_599;
  _test_case test_cases [29];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)test_cases,"GL_ARB_gpu_shader_fp64 is not supported.",&local_5b5);
    tcu::NotSupportedError::NotSupportedError(pNVar2,(string *)test_cases);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_vertex_attrib_64bit")
  ;
  if (bVar1) {
    initTest(this);
    test_cases[0].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0].src_type = VARIABLE_TYPE_INT;
    test_cases[0].dst_type = VARIABLE_TYPE_DOUBLE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5b5);
    test_cases[1].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[1].src_type = VARIABLE_TYPE_IVEC2;
    test_cases[1].dst_type = VARIABLE_TYPE_DVEC2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[1].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_599);
    test_cases[2].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[2].src_type = VARIABLE_TYPE_IVEC3;
    test_cases[2].dst_type = VARIABLE_TYPE_DVEC3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[2].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_59a);
    test_cases[3].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[3].src_type = VARIABLE_TYPE_IVEC4;
    test_cases[3].dst_type = VARIABLE_TYPE_DVEC4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[3].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_59b);
    test_cases[4].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[4].src_type = VARIABLE_TYPE_UINT;
    test_cases[4].dst_type = VARIABLE_TYPE_DOUBLE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[4].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_59c);
    test_cases[5].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[5].src_type = VARIABLE_TYPE_UVEC2;
    test_cases[5].dst_type = VARIABLE_TYPE_DVEC2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[5].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_59d);
    test_cases[6].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[6].src_type = VARIABLE_TYPE_UVEC3;
    test_cases[6].dst_type = VARIABLE_TYPE_DVEC3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[6].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_59e);
    test_cases[7].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[7].src_type = VARIABLE_TYPE_UVEC4;
    test_cases[7].dst_type = VARIABLE_TYPE_DVEC4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[7].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_59f);
    test_cases[8].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[8].src_type = VARIABLE_TYPE_FLOAT;
    test_cases[8].dst_type = VARIABLE_TYPE_DOUBLE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[8].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a0);
    test_cases[9].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[9].src_type = VARIABLE_TYPE_VEC2;
    test_cases[9].dst_type = VARIABLE_TYPE_DVEC2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[9].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a1);
    test_cases[10].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[10].src_type = VARIABLE_TYPE_VEC3;
    test_cases[10].dst_type = VARIABLE_TYPE_DVEC3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[10].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a2);
    test_cases[0xb].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0xb].src_type = VARIABLE_TYPE_VEC4;
    test_cases[0xb].dst_type = VARIABLE_TYPE_DVEC4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xb].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a3);
    test_cases[0xc].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0xc].src_type = VARIABLE_TYPE_MAT2;
    test_cases[0xc].dst_type = VARIABLE_TYPE_DMAT2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xc].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a4);
    test_cases[0xd].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0xd].src_type = VARIABLE_TYPE_MAT3;
    test_cases[0xd].dst_type = VARIABLE_TYPE_DMAT3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xd].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a5);
    test_cases[0xe].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0xe].src_type = VARIABLE_TYPE_MAT4;
    test_cases[0xe].dst_type = VARIABLE_TYPE_DMAT4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xe].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a6);
    test_cases[0xf].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0xf].src_type = VARIABLE_TYPE_MAT2X3;
    test_cases[0xf].dst_type = VARIABLE_TYPE_DMAT2X3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0xf].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a7);
    test_cases[0x10].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0x10].src_type = VARIABLE_TYPE_MAT2X4;
    test_cases[0x10].dst_type = VARIABLE_TYPE_DMAT2X4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x10].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a8);
    test_cases[0x11].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0x11].src_type = VARIABLE_TYPE_MAT3X2;
    test_cases[0x11].dst_type = VARIABLE_TYPE_DMAT3X2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x11].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5a9);
    test_cases[0x12].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0x12].src_type = VARIABLE_TYPE_MAT3X4;
    test_cases[0x12].dst_type = VARIABLE_TYPE_DMAT3X4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x12].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5aa);
    test_cases[0x13].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0x13].src_type = VARIABLE_TYPE_MAT4X2;
    test_cases[0x13].dst_type = VARIABLE_TYPE_DMAT4X2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x13].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5ab);
    test_cases[0x14].type = TEST_CASE_TYPE_IMPLICIT;
    test_cases[0x14].src_type = VARIABLE_TYPE_MAT4X3;
    test_cases[0x14].dst_type = VARIABLE_TYPE_DMAT4X3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x14].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5ac);
    test_cases[0x15].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x15].src_type = VARIABLE_TYPE_INT;
    test_cases[0x15].dst_type = VARIABLE_TYPE_DOUBLE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x15].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5ad);
    test_cases[0x16].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x16].src_type = VARIABLE_TYPE_UINT;
    test_cases[0x16].dst_type = VARIABLE_TYPE_DOUBLE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x16].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5ae);
    test_cases[0x17].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x17].src_type = VARIABLE_TYPE_FLOAT;
    test_cases[0x17].dst_type = VARIABLE_TYPE_DOUBLE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x17].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5af);
    test_cases[0x18].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x18].src_type = VARIABLE_TYPE_DOUBLE;
    test_cases[0x18].dst_type = VARIABLE_TYPE_INT;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x18].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5b0);
    test_cases[0x19].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x19].src_type = VARIABLE_TYPE_DOUBLE;
    test_cases[0x19].dst_type = VARIABLE_TYPE_UINT;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x19].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5b1);
    test_cases[0x1a].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x1a].src_type = VARIABLE_TYPE_DOUBLE;
    test_cases[0x1a].dst_type = VARIABLE_TYPE_FLOAT;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1a].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5b2);
    test_cases[0x1b].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x1b].src_type = VARIABLE_TYPE_DOUBLE;
    test_cases[0x1b].dst_type = VARIABLE_TYPE_BOOL;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1b].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5b3);
    test_cases[0x1c].type = TEST_CASE_TYPE_EXPLICIT;
    test_cases[0x1c].src_type = VARIABLE_TYPE_BOOL;
    test_cases[0x1c].dst_type = VARIABLE_TYPE_DOUBLE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&test_cases[0x1c].shader_body,glcts::fixed_sample_locations_values + 1,
               &local_5b4);
    for (lVar3 = 0; lVar3 != 0x570; lVar3 = lVar3 + 0x30) {
      test_case = (_test_case *)((long)&test_cases[0].type + lVar3);
      initIteration(this,test_case);
      bVar1 = executeIteration(this,test_case);
      this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar1);
      deinitInteration(this);
    }
    description = "Fail";
    if (this->m_has_test_passed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               this->m_has_test_passed ^ QP_TEST_RESULT_FAIL,description);
    lVar3 = 0x550;
    do {
      std::__cxx11::string::~string((string *)((long)&test_cases[0].type + lVar3));
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != -0x20);
    return STOP;
  }
  pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)test_cases,"GL_ARB_vertex_attrib_64bit is not supported.",&local_5b5);
  tcu::NotSupportedError::NotSupportedError(pNVar2,(string *)test_cases);
  __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test5::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit"))
	{
		throw tcu::NotSupportedError("GL_ARB_vertex_attrib_64bit is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	_test_case test_cases[] = {
		/* test case type */ /* source type */ /* destination type */
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, "" },
		{ TEST_CASE_TYPE_IMPLICIT, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, "" },

		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_INT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_UINT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_FLOAT, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_BOOL, "" },
		{ TEST_CASE_TYPE_EXPLICIT, Utils::VARIABLE_TYPE_BOOL, Utils::VARIABLE_TYPE_DOUBLE, "" }
	};
	const unsigned int n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Execute all iterations */
	for (unsigned int n_test_case = 0; n_test_case < n_test_cases; ++n_test_case)
	{
		_test_case& test_case = test_cases[n_test_case];

		/* Initialize a program object we will use to perform the casting */
		initIteration(test_case);

		/* Use the program object to XFB the results */
		m_has_test_passed &= executeIteration(test_case);

		/* Release the GL Resource for this sub test */
		deinitInteration();

	} /* for (all test cases) */
	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}